

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  int64_t iVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  int64_t iVar5;
  undefined4 extraout_var_00;
  int64_t iVar6;
  undefined4 extraout_var_01;
  LogFinisher local_e1;
  LogMessage local_e0;
  string local_a8;
  string local_88;
  LogMessage local_68;
  ulong value;
  
  iVar3 = (*this->_vptr_MessageLite[8])();
  value = CONCAT44(extraout_var,iVar3);
  if ((value & 0xffffffff80000000) == 0) {
    iVar5 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
    iVar1 = output->start_count_;
    iVar3 = (*this->_vptr_MessageLite[0xb])(this,output->cur_,output);
    output->cur_ = (uint8_t *)CONCAT44(extraout_var_00,iVar3);
    bVar2 = io::CodedOutputStream::HadError(output);
    if (!bVar2) {
      iVar6 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
      if (value != (long)(((int)iVar1 + (int)iVar6) - ((int)iVar5 + (int)output->start_count_))) {
        iVar3 = (*this->_vptr_MessageLite[8])(this);
        if (value != CONCAT44(extraout_var_01,iVar3)) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                     ,0x54);
          pLVar4 = internal::LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                             );
          (*this->_vptr_MessageLite[2])(&local_88,this);
          pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_88);
          pLVar4 = internal::LogMessage::operator<<
                             (pLVar4," was modified concurrently during serialization.");
          internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        if (value != CONCAT44(extraout_var_01,iVar3)) {
          internal::LogMessage::~LogMessage(&local_68);
        }
        internal::LogMessage::LogMessage
                  (&local_e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x57);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_e0,
                            "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                           );
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,
                            "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                           );
        (*this->_vptr_MessageLite[2])(&local_a8,this);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_a8);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,".");
        internal::LogFinisher::operator=(&local_e1,pLVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        internal::LogMessage::~LogMessage(&local_e0);
        internal::LogMessage::LogMessage
                  (&local_e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x5c);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_e0,"This shouldn\'t be called if all the sizes are equal.");
        internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar4);
        internal::LogMessage::~LogMessage(&local_e0);
      }
    }
    bVar2 = !bVar2;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x175);
    (*this->_vptr_MessageLite[2])(&local_e0,this);
    pLVar4 = internal::LogMessage::operator<<(&local_68,(string *)&local_e0);
    pLVar4 = internal::LogMessage::operator<<(pLVar4," exceeded maximum protobuf size of 2GB: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
    if (local_e0._0_8_ != (long)&local_e0 + 0x10U) {
      operator_delete((void *)local_e0._0_8_);
    }
    internal::LogMessage::~LogMessage(&local_68);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != static_cast<int64_t>(size)) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}